

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer::
visitLocalGet(wasm::LocalGet__(void *this,LocalGet *curr)

{
  int *piVar1;
  _Rb_tree_color index;
  int iVar2;
  Function *this_00;
  long lVar3;
  bool bVar4;
  value_type vVar5;
  value_type vVar6;
  Set *pSVar7;
  Type TVar8;
  Type TVar9;
  _Base_ptr p_Var10;
  _Rb_tree_color index_00;
  undefined1 local_60 [8];
  anon_class_16_2_3fdeafed getNumGetsIgnoringCurr;
  LocalGet *local_40;
  LocalGet *curr_local;
  
  local_40 = curr;
  pSVar7 = EquivalentSets::getEquivalents((EquivalentSets *)((long)this + 0x1b0),curr->index);
  if (pSVar7 != (Set *)0x0) {
    getNumGetsIgnoringCurr.this = (EquivalentOptimizer *)&stack0xffffffffffffffc0;
    this_00 = *(Function **)((long)this + 200);
    index_00 = ~_S_red;
    local_60 = (undefined1  [8])this;
    getNumGetsIgnoringCurr.curr = (LocalGet **)this;
    for (p_Var10 = (pSVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(pSVar7->_M_t)._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      index = p_Var10[1]._M_color;
      if (index_00 == ~_S_red) {
LAB_00bb6bf1:
        index_00 = index;
      }
      else {
        curr_local._4_4_ = index_00;
        TVar8 = Function::getLocalType(this_00,index_00);
        TVar9 = Function::getLocalType(this_00,index);
        bVar4 = wasm::Type::isSubType(TVar9,TVar8);
        index_00 = curr_local._4_4_;
        if (bVar4) {
          if (TVar9.id == TVar8.id) {
            vVar5 = SimplifyLocals<true,_true,_true>::runLateOptimizations::EquivalentOptimizer::
                    visitLocalGet::anon_class_16_2_3fdeafed::operator()
                              ((anon_class_16_2_3fdeafed *)local_60,index);
            vVar6 = SimplifyLocals<true,_true,_true>::runLateOptimizations::EquivalentOptimizer::
                    visitLocalGet::anon_class_16_2_3fdeafed::operator()
                              ((anon_class_16_2_3fdeafed *)local_60,curr_local._4_4_);
            index_00 = curr_local._4_4_;
            if (vVar5 <= vVar6) goto LAB_00bb6bfd;
          }
          goto LAB_00bb6bf1;
        }
      }
LAB_00bb6bfd:
    }
    if (index_00 == ~_S_red) {
      __assert_fail("best != Index(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x450,
                    "void wasm::SimplifyLocals<>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    TVar8 = Function::getLocalType(this_00,index_00);
    TVar9 = Function::getLocalType(this_00,local_40->index);
    if ((index_00 != local_40->index) && (bVar4 = wasm::Type::isSubType(TVar8,TVar9), bVar4)) {
      vVar5 = SimplifyLocals<true,_true,_true>::runLateOptimizations::EquivalentOptimizer::
              visitLocalGet::anon_class_16_2_3fdeafed::operator()
                        ((anon_class_16_2_3fdeafed *)local_60,index_00);
      vVar6 = SimplifyLocals<true,_true,_true>::runLateOptimizations::EquivalentOptimizer::
              visitLocalGet::anon_class_16_2_3fdeafed::operator()
                        ((anon_class_16_2_3fdeafed *)local_60,local_40->index);
      if ((vVar6 < vVar5) || (TVar8.id != TVar9.id)) {
        lVar3 = *(long *)&(getNumGetsIgnoringCurr.curr[0x1c]->
                          super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression;
        piVar1 = (int *)(lVar3 + (ulong)index_00 * 4);
        *piVar1 = *piVar1 + 1;
        iVar2 = *(int *)(lVar3 + (ulong)local_40->index * 4);
        if (iVar2 == 0) {
          __assert_fail("(*numLocalGets)[curr->index] >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x45d,
                        "void wasm::SimplifyLocals<>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
        *(int *)(lVar3 + (ulong)local_40->index * 4) = iVar2 + -1;
        local_40->index = index_00;
        *(undefined1 *)(getNumGetsIgnoringCurr.curr + 0x35) = 1;
        if (TVar8.id != TVar9.id) {
          TVar8 = Function::getLocalType(this_00,index_00);
          (local_40->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
               TVar8.id;
          *(undefined1 *)((long)getNumGetsIgnoringCurr.curr + 0x1a9) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
        // Canonicalize gets: if some are equivalent, then we can pick more
        // then one, and other passes may benefit from having more uniformity.
        if (auto* set = equivalences.getEquivalents(curr->index)) {
          // Helper method that returns the # of gets *ignoring the current
          // get*, as we want to see what is best overall, treating this one as
          // to be decided upon.
          auto getNumGetsIgnoringCurr = [&](Index index) {
            auto ret = (*numLocalGets)[index];
            if (index == curr->index) {
              assert(ret >= 1);
              ret--;
            }
            return ret;
          };

          // Pick the index with the most uses - maximizing the chance to
          // lower one's uses to zero. If types differ though then we prefer to
          // switch to a more refined type even if there are fewer uses, as that
          // may have significant benefits to later optimizations (we may be
          // able to use it to remove casts, etc.).
          auto* func = this->getFunction();
          Index best = -1;
          for (auto index : *set) {
            if (best == Index(-1)) {
              // This is the first possible option we've seen.
              best = index;
              continue;
            }

            auto bestType = func->getLocalType(best);
            auto addressType = func->getLocalType(index);
            if (!Type::isSubType(addressType, bestType)) {
              // This is less refined than the current best; ignore.
              continue;
            }

            // This is better if it has a more refined type, or if it has more
            // uses.
            if (addressType != bestType ||
                getNumGetsIgnoringCurr(index) > getNumGetsIgnoringCurr(best)) {
              best = index;
            }
          }
          assert(best != Index(-1));
          // Due to ordering, the best index may be different from us but have
          // the same # of locals - make sure we actually improve, either adding
          // more gets, or a more refined type (and never change to a less
          // refined type).
          auto bestType = func->getLocalType(best);
          auto oldType = func->getLocalType(curr->index);
          if (best != curr->index && Type::isSubType(bestType, oldType)) {
            auto hasMoreGets = getNumGetsIgnoringCurr(best) >
                               getNumGetsIgnoringCurr(curr->index);
            if (hasMoreGets || bestType != oldType) {
              // Update the get counts.
              (*numLocalGets)[best]++;
              assert((*numLocalGets)[curr->index] >= 1);
              (*numLocalGets)[curr->index]--;
              // Make the change.
              curr->index = best;
              anotherCycle = true;
              if (bestType != oldType) {
                curr->type = func->getLocalType(best);
                // We are switching to a more refined type, which might require
                // changes in the user of the local.get.
                refinalize = true;
              }
            }
          }
        }
      }